

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flooxs_gen.cpp
# Opt level: O2

int get_layer_height(map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                     *my_layer_info,vector<int,_std::allocator<int>_> *layer_order)

{
  mapped_type *pmVar1;
  int iVar2;
  pointer __k;
  
  iVar2 = 0;
  for (__k = (layer_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
      __k != (layer_order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish; __k = __k + 1) {
    pmVar1 = std::
             map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
             ::operator[](my_layer_info,__k);
    if (pmVar1->film_type != 'A') {
      pmVar1 = std::
               map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
               ::operator[](my_layer_info,__k);
      if (pmVar1->film_type != 'Z') {
        pmVar1 = std::
                 map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                 ::operator[](my_layer_info,__k);
        iVar2 = iVar2 + pmVar1->thickness;
      }
    }
  }
  return iVar2;
}

Assistant:

int get_layer_height(std::map<int, layer_data> my_layer_info,
                     std::vector<int> &layer_order)
{
  int layer_height = 0;
  for (auto layer_order_it = layer_order.begin();
       layer_order_it != layer_order.end(); layer_order_it++) {
    if (!((my_layer_info[*layer_order_it].film_type == 'A') ||
          (my_layer_info[*layer_order_it].film_type == 'Z'))) {
      layer_height = layer_height + my_layer_info[*layer_order_it].thickness;
    }
  }
  return layer_height;
}